

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O3

void Model<Slot>::readFromFile(string *filename)

{
  long *plVar1;
  fstream file;
  Slot object;
  string asStack_1528 [528];
  pair<int,_Slot> local_1318;
  Slot local_9a0;
  
  std::fstream::fstream(asStack_1528);
  std::fstream::open(asStack_1528,(_Ios_Openmode)filename);
  Slot::Slot(&local_9a0);
  while( true ) {
    plVar1 = (long *)std::istream::read((char *)asStack_1528,(long)&local_9a0);
    if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) break;
    local_1318.first = local_9a0.super_Model<Slot>.id;
    local_1318.second.super_Model<Slot>.id = local_9a0.super_Model<Slot>.id;
    local_1318.second.super_Model<Slot>._vptr_Model = (_func_int **)&PTR_save_0012c2a8;
    local_1318.second.requestedBy.super_BaseUser.super_Model<BaseUser>.id =
         local_9a0.requestedBy.super_BaseUser.super_Model<BaseUser>.id;
    memcpy(&local_1318.second.requestedBy.super_BaseUser.super_Model<BaseUser>.field_0xc,
           &local_9a0.requestedBy.super_BaseUser.super_Model<BaseUser>.field_0xc,0xe1);
    local_1318.second.requestedBy.super_BaseUser.super_Model<BaseUser>._vptr_Model =
         (_func_int **)&PTR_save_0012bf18;
    local_1318.second.room.super_Model<Room>.id = local_9a0.room.super_Model<Room>.id;
    local_1318.second.room.super_Model<Room>._vptr_Model = (_func_int **)&PTR_save_0012c2e0;
    local_1318.second.room.audio = local_9a0.room.audio;
    local_1318.second.room.video = local_9a0.room.video;
    local_1318.second.room.super_Model<Room>._12_4_ = local_9a0.room.super_Model<Room>._12_4_;
    local_1318.second.room.strength = local_9a0.room.strength;
    memcpy(&local_1318.second.startTime,&local_9a0.startTime,0x854);
    std::
    _Rb_tree<int,std::pair<int_const,Slot>,std::_Select1st<std::pair<int_const,Slot>>,std::less<int>,std::allocator<std::pair<int_const,Slot>>>
    ::_M_emplace_unique<std::pair<int,Slot>>
              ((_Rb_tree<int,std::pair<int_const,Slot>,std::_Select1st<std::pair<int_const,Slot>>,std::less<int>,std::allocator<std::pair<int_const,Slot>>>
                *)&objectList,&local_1318);
  }
  std::fstream::close();
  std::fstream::~fstream(asStack_1528);
  return;
}

Assistant:

void Model<T>::readFromFile(const string &filename) {
    fstream file;
    file.open(filename, ios::in | ios::out | ios::binary);
    T object;
    while (file.read((char *) &object, sizeof(object))) {
        Model<T>::objectList.insert(pair<int, T>(object.id, object));
    }
    file.close();
}